

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

int xm_check_sanity_preload(char *module,size_t module_length)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  iVar1 = 4;
  if (0x3b < module_length) {
    auVar2[0] = -(*module == 'E');
    auVar2[1] = -(module[1] == 'x');
    auVar2[2] = -(module[2] == 't');
    auVar2[3] = -(module[3] == 'e');
    auVar2[4] = -(module[4] == 'n');
    auVar2[5] = -(module[5] == 'd');
    auVar2[6] = -(module[6] == 'e');
    auVar2[7] = -(module[7] == 'd');
    auVar2[8] = -(module[8] == ' ');
    auVar2[9] = -(module[9] == 'M');
    auVar2[10] = -(module[10] == 'o');
    auVar2[0xb] = -(module[0xb] == 'd');
    auVar2[0xc] = -(module[0xc] == 'u');
    auVar2[0xd] = -(module[0xd] == 'l');
    auVar2[0xe] = -(module[0xe] == 'e');
    auVar2[0xf] = -(module[0xf] == ':');
    auVar3[0] = -(module[0x10] == ' ');
    auVar3[1] = 0xff;
    auVar3[2] = 0xff;
    auVar3[3] = 0xff;
    auVar3[4] = 0xff;
    auVar3[5] = 0xff;
    auVar3[6] = 0xff;
    auVar3[7] = 0xff;
    auVar3[8] = 0xff;
    auVar3[9] = 0xff;
    auVar3[10] = 0xff;
    auVar3[0xb] = 0xff;
    auVar3[0xc] = 0xff;
    auVar3[0xd] = 0xff;
    auVar3[0xe] = 0xff;
    auVar3[0xf] = 0xff;
    auVar3 = auVar3 & auVar2;
    iVar1 = 1;
    if ((((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) &&
        (iVar1 = 2, module[0x25] == '\x1a')) && (iVar1 = 3, module[0x3b] == '\x01')) {
      return (uint)(module[0x3a] != '\x04') * 3;
    }
  }
  return iVar1;
}

Assistant:

int xm_check_sanity_preload(const char* module, size_t module_length) {
	if(module_length < 60) {
		return 4;
	}

	if(memcmp("Extended Module: ", module, 17) != 0) {
		return 1;
	}

	if(module[37] != 0x1A) {
		return 2;
	}

	if(module[59] != 0x01 || module[58] != 0x04) {
		/* Not XM 1.04 */
		return 3;
	}

	return 0;
}